

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

json_token * find_json_token(json_token *toks,char *path)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  
  do {
    if ((path == (char *)0x0) || (cVar2 = *path, cVar2 == '\0')) {
      return (json_token *)0x0;
    }
    uVar9 = 0;
    cVar5 = cVar2;
    while (((cVar5 != '\0' && (cVar5 != '.')) && (cVar5 != '['))) {
      lVar4 = uVar9 + 1;
      uVar9 = uVar9 + 1;
      cVar5 = path[lVar4];
    }
    if (cVar2 == '[') {
      if (toks->type != JSON_TYPE_ARRAY) {
        return (json_token *)0x0;
      }
      uVar10 = (uint)path[1];
      if (uVar10 - 0x3a < 0xfffffff6) {
        return (json_token *)0x0;
      }
      iVar6 = 0;
      uVar9 = 2;
      while( true ) {
        if ((char)uVar10 == '\0') {
          return (json_token *)0x0;
        }
        if ((uVar10 & 0xff) == 0x5d) break;
        uVar10 = (int)(char)uVar10 - 0x30;
        if (9 < uVar10) {
          return (json_token *)0x0;
        }
        iVar6 = uVar10 + iVar6 * 10;
        uVar10 = (uint)(byte)path[uVar9];
        uVar9 = uVar9 + 1;
      }
      iVar3 = 1;
    }
    else {
      if (toks->type != JSON_TYPE_OBJECT) {
        return (json_token *)0x0;
      }
      iVar6 = -1;
      iVar3 = 2;
    }
    iVar11 = 0;
    iVar8 = (int)uVar9;
    uVar13 = 0;
    if (0 < iVar8) {
      uVar13 = uVar9 & 0xffffffff;
    }
    iVar7 = 0;
    for (; iVar11 < toks->num_desc; iVar11 = iVar11 + iVar3) {
      if (iVar6 == -1) {
        if (toks[(long)iVar11 + 1].type != JSON_TYPE_STRING) {
          return (json_token *)0x0;
        }
        if (toks[(long)iVar11 + 1].len == iVar8) {
          for (uVar9 = 0;
              (uVar12 = uVar13, uVar13 != uVar9 &&
              (uVar12 = uVar9, path[uVar9] == toks[(long)iVar11 + 1].ptr[uVar9])); uVar9 = uVar9 + 1
              ) {
          }
          if ((int)uVar12 == iVar8) goto LAB_00105fac;
        }
      }
      else if (iVar7 == iVar6) {
LAB_00105fac:
        iVar11 = iVar3 + -1 + iVar11;
        break;
      }
      lVar4 = (long)(iVar3 + -1 + iVar11);
      if ((toks[lVar4 + 1].type | JSON_TYPE_TRUE) == JSON_TYPE_ARRAY) {
        iVar11 = iVar11 + toks[lVar4 + 1].num_desc;
      }
      iVar7 = iVar7 + 1;
    }
    if (iVar11 == toks->num_desc) {
      return (json_token *)0x0;
    }
    toks = toks + (long)iVar11 + 1;
    pcVar1 = path + (ulong)(path[iVar8] == '.') + (long)iVar8;
    path = path + (ulong)(path[iVar8] == '.') + (long)iVar8;
    if (*pcVar1 == '\0') {
      return toks;
    }
  } while( true );
}

Assistant:

struct json_token *find_json_token(struct json_token *toks, const char *path) {
    while (path != 0 && path[0] != '\0') {
        int i, ind2 = 0, ind = -1, skip = 2, n = path_part_len(path);
        if (path[0] == '[') {
            if (toks->type != JSON_TYPE_ARRAY || !is_digit(path[1])) return 0;
            for (ind = 0, n = 1; path[n] != ']' && path[n] != '\0'; n++) {
                if (!is_digit(path[n])) return 0;
                ind *= 10;
                ind += path[n] - '0';
            }
            if (path[n++] != ']') return 0;
            skip = 1;  /* In objects, we skip 2 elems while iterating, in arrays 1. */
        } else if (toks->type != JSON_TYPE_OBJECT) return 0;
        toks++;
        for (i = 0; i < toks[-1].num_desc; i += skip, ind2++) {
            /* ind == -1 indicated that we're iterating an array, not object */
            if (ind == -1 && toks[i].type != JSON_TYPE_STRING) return 0;
            if (ind2 == ind ||
                (ind == -1 && toks[i].len == n && compare(path, toks[i].ptr, n))) {
                i += skip - 1;
                break;
            };
            if (toks[i - 1 + skip].type == JSON_TYPE_ARRAY ||
                toks[i - 1 + skip].type == JSON_TYPE_OBJECT) {
                i += toks[i - 1 + skip].num_desc;
            }
        }
        if (i == toks[-1].num_desc) return 0;
        path += n;
        if (path[0] == '.') path++;
        if (path[0] == '\0') return &toks[i];
        toks += i;
    }
    return 0;
}